

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O2

void reset_monsters(void)

{
  wchar_t idx;
  monster *pmVar1;
  
  idx = cave_monster_max(cave);
  while (L'\x01' < idx) {
    idx = idx + L'\xffffffff';
    pmVar1 = cave_monster(cave,idx);
    flag_off(pmVar1->mflag,2,9);
  }
  return;
}

Assistant:

void reset_monsters(void)
{
	int i;
	struct monster *mon;

	/* Process the monsters (backwards) */
	for (i = cave_monster_max(cave) - 1; i >= 1; i--) {
		/* Access the monster */
		mon = cave_monster(cave, i);

		/* Monster is ready to go again */
		mflag_off(mon->mflag, MFLAG_HANDLED);
	}
}